

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsFreewheel::ArchiveIN(ChShaftsFreewheel *this,ChArchiveIn *marchive)

{
  ChNameValue<bool> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsFreewheel>(marchive);
  ChShaftsCouple::ArchiveIN(&this->super_ChShaftsCouple,marchive);
  local_30._value = &this->step;
  local_30._name = "step";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->jamming_mode;
  local_48._name = "jamming_mode";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->phase;
  local_60._name = "phase";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->alpha_max;
  local_78._name = "alpha_max";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->free_forward;
  local_90._name = "free_forward";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  return;
}

Assistant:

void ChShaftsFreewheel::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsFreewheel>();

    // deserialize parent class:
    ChShaftsCouple::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(step);
    marchive >> CHNVP(jamming_mode);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(alpha_max);
    marchive >> CHNVP(free_forward);
}